

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_cascadedUnitsManuallyImportedWithoutImportSourcesAddedToImporter_Test::TestBody
          (ModelFlattening_cascadedUnitsManuallyImportedWithoutImportSourcesAddedToImporter_Test
           *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  char *pcVar8;
  AssertHelper local_570 [8];
  Message local_568 [8];
  shared_ptr<libcellml::Issue> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_1;
  Message local_518 [8];
  unsigned_long local_510 [2];
  undefined1 local_500 [8];
  AssertionResult gtest_ar;
  ModelPtr flatModel;
  AssertHelper local_4c0 [8];
  Message local_4b8 [15];
  bool local_4a9;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_;
  string local_490 [39];
  allocator<char> local_469;
  string local_468 [39];
  allocator<char> local_441;
  string local_440 [32];
  undefined1 local_420 [8];
  ImportSourcePtr importSource2;
  string local_408 [32];
  undefined1 local_3e8 [8];
  ImportSourcePtr importSource1;
  PrinterPtr printer;
  string local_3c0 [32];
  undefined1 local_3a0 [8];
  UnitsPtr importedUnits2;
  string local_388 [32];
  undefined1 local_368 [8];
  UnitsPtr importedUnits1;
  string local_350 [32];
  undefined1 local_330 [8];
  VariablePtr variable;
  string local_318 [32];
  undefined1 local_2f8 [8];
  ComponentPtr component1;
  string local_2e0 [39];
  allocator<char> local_2b9;
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290 [32];
  undefined1 local_270 [8];
  UnitsPtr thirdUnits;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [32];
  undefined1 local_1c0 [8];
  UnitsPtr secondUnits;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [32];
  undefined1 local_110 [8];
  UnitsPtr firstUnits;
  string local_f8 [32];
  undefined1 local_d8 [8];
  ModelPtr importModel2;
  string local_c0 [32];
  undefined1 local_a0 [8];
  ModelPtr importModel1;
  string local_88 [32];
  undefined1 local_68 [8];
  ModelPtr model;
  ImporterPtr importer;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string e;
  ModelFlattening_cascadedUnitsManuallyImportedWithoutImportSourcesAddedToImporter_Test *this_local;
  
  e.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "Cyclic dependencies were found when attempting to flatten units in the model \'model\'. The dependency loop is:\n - units \'units1_import\' specifies an import from \':this:\' to \':this:\'; and\n - units \'units2_import\' specifies an import from \':this:\' to \':this:\'."
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  libcellml::Importer::create((bool)((char)&model + '\b'));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"model",
             (allocator<char> *)
             ((long)&importModel1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Model::create((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importModel1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"importModel1",
             (allocator<char> *)
             ((long)&importModel2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Model::create((string *)local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importModel2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"importModel2",
             (allocator<char> *)
             ((long)&firstUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Model::create((string *)local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&firstUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"first_units",&local_131);
  libcellml::Units::create((string *)local_110);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"second",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"",&local_181);
  libcellml::Units::addUnit((string *)peVar3,-1.0,local_158);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a8,"units1_import",
             (allocator<char> *)
             ((long)&secondUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar3);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&secondUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"second_units",&local_1e1);
  libcellml::Units::create((string *)local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_208,"second",&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_230,"",&local_231);
  libcellml::Units::addUnit((string *)peVar3,-2.0,local_208);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,"units2_import",
             (allocator<char> *)
             ((long)&thirdUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar3);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&thirdUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_290,"third_units",&local_291);
  libcellml::Units::create((string *)local_270);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator(&local_291);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"second",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e0,"",
             (allocator<char> *)
             ((long)&component1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  libcellml::Units::addUnit((string *)peVar3,-0.5,local_2b8);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&component1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_318,"base_component",
             (allocator<char> *)
             ((long)&variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::create((string *)local_2f8);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_350,"variable",
             (allocator<char> *)
             ((long)&importedUnits1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  libcellml::Variable::create((string *)local_330);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importedUnits1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_330);
  libcellml::Variable::setUnits((shared_ptr *)peVar4);
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_2f8);
  libcellml::Component::addVariable((shared_ptr *)peVar5);
  peVar6 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  libcellml::Model::addUnits((shared_ptr *)peVar6);
  peVar6 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_388,"units1_import",
             (allocator<char> *)
             ((long)&importedUnits2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  libcellml::Units::create((string *)local_368);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importedUnits2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c0,"units2_import",
             (allocator<char> *)
             ((long)&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::create((string *)local_3a0);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar6 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  libcellml::Model::addUnits((shared_ptr *)peVar6);
  peVar6 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_a0);
  libcellml::Model::addUnits((shared_ptr *)peVar6);
  peVar6 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_a0);
  libcellml::Model::addUnits((shared_ptr *)peVar6);
  peVar6 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d8);
  libcellml::Model::addUnits((shared_ptr *)peVar6);
  libcellml::Printer::create();
  libcellml::ImportSource::create();
  peVar7 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_408,"model1.cellml",
             (allocator<char> *)
             ((long)&importSource2.
                     super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ImportSource::setUrl((string *)peVar7);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importSource2.
                     super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar7 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3e8);
  libcellml::ImportSource::setModel((shared_ptr *)peVar7);
  libcellml::ImportSource::create();
  peVar7 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_420);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_440,"model2.cellml",&local_441);
  libcellml::ImportSource::setUrl((string *)peVar7);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator(&local_441);
  peVar7 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_420);
  libcellml::ImportSource::setModel((shared_ptr *)peVar7);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_368);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar3 + 0x10));
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_468,"second_units",&local_469);
  libcellml::ImportedEntity::setImportReference((string *)(peVar3 + 0x10));
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator(&local_469);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3a0);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar3 + 0x10));
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_490,"third_units",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::ImportedEntity::setImportReference((string *)(peVar3 + 0x10));
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_68);
  bVar1 = libcellml::Model::hasUnresolvedImports();
  local_4a9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4a8,&local_4a9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar2) {
    testing::Message::Message(local_4b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)
               &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_4a8,"model->hasUnresolvedImports()","true");
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x50b,pcVar8);
    testing::internal::AssertHelper::operator=(local_4c0,local_4b8);
    testing::internal::AssertHelper::~AssertHelper(local_4c0);
    std::__cxx11::string::~string
              ((string *)
               &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Importer::flattenModel((shared_ptr *)&gtest_ar.message_);
  local_510[1] = 1;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_510[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_500,"size_t(1)","importer->issueCount()",local_510 + 1,
             local_510);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar2) {
    testing::Message::Message(local_518);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x50e,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::issue((ulong)&local_560);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_560);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_530,"e","importer->issue(0)->description()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_560);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar2) {
    testing::Message::Message(local_568);
    pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              (local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x50f,pcVar8);
    testing::internal::AssertHelper::operator=(local_570,local_568);
    testing::internal::AssertHelper::~AssertHelper(local_570);
    testing::Message::~Message(local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&gtest_ar.message_)
  ;
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_420);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_3e8);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)
             &importSource1.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_3a0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_368);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_330);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_2f8);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_270);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_1c0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_110);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_d8);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_a0);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_68);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ModelFlattening, cascadedUnitsManuallyImportedWithoutImportSourcesAddedToImporter)
{
    const std::string e =
        "Cyclic dependencies were found when attempting to flatten units in the model 'model'. The dependency loop is:\n"
        " - units 'units1_import' specifies an import from ':this:' to ':this:'; and\n"
        " - units 'units2_import' specifies an import from ':this:' to ':this:'.";

    auto importer = libcellml::Importer::create();

    auto model = libcellml::Model::create("model");
    auto importModel1 = libcellml::Model::create("importModel1");
    auto importModel2 = libcellml::Model::create("importModel2");

    auto firstUnits = libcellml::Units::create("first_units");
    firstUnits->addUnit("second", -1.0);
    firstUnits->addUnit("units1_import");

    auto secondUnits = libcellml::Units::create("second_units");
    secondUnits->addUnit("second", -2.0);
    secondUnits->addUnit("units2_import");

    auto thirdUnits = libcellml::Units::create("third_units");
    thirdUnits->addUnit("second", -0.5);

    auto component1 = libcellml::Component::create("base_component");
    auto variable = libcellml::Variable::create("variable");
    variable->setUnits(firstUnits);
    component1->addVariable(variable);

    model->addUnits(firstUnits);
    model->addComponent(component1);

    auto importedUnits1 = libcellml::Units::create("units1_import");
    auto importedUnits2 = libcellml::Units::create("units2_import");

    model->addUnits(importedUnits1);
    importModel1->addUnits(secondUnits);
    importModel1->addUnits(importedUnits2);
    importModel2->addUnits(thirdUnits);

    auto printer = libcellml::Printer::create();

    auto importSource1 = libcellml::ImportSource::create();
    importSource1->setUrl("model1.cellml");
    importSource1->setModel(importModel1);

    auto importSource2 = libcellml::ImportSource::create();
    importSource2->setUrl("model2.cellml");
    importSource2->setModel(importModel2);

    importedUnits1->setImportSource(importSource1);
    importedUnits1->setImportReference("second_units");

    importedUnits2->setImportSource(importSource2);
    importedUnits2->setImportReference("third_units");

    EXPECT_FALSE(model->hasUnresolvedImports());

    auto flatModel = importer->flattenModel(model);
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(e, importer->issue(0)->description());
}